

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

bool __thiscall
wallet::LegacyScriptPubKeyMan::AddWatchOnly(LegacyScriptPubKeyMan *this,CScript *dest)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer *__ptr;
  long in_FS_OFFSET;
  WalletBatch local_38;
  long local_28;
  WalletDatabase *pWVar3;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3])
                    ();
  pWVar3 = (WalletDatabase *)CONCAT44(extraout_var,iVar2);
  (*pWVar3->_vptr_WalletDatabase[0xe])(&local_38,pWVar3,1);
  local_38.m_database = pWVar3;
  bVar1 = AddWatchOnlyWithDB(this,&local_38,dest);
  if ((_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)
      local_38.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_38.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::AddWatchOnly(const CScript& dest)
{
    WalletBatch batch(m_storage.GetDatabase());
    return AddWatchOnlyWithDB(batch, dest);
}